

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrasalrule.h
# Opt level: O1

void jhu::thrax::printRhs<false>(ostream *out,PhrasalRule *rule)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  NT *pNVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  Rhs *__range2;
  int iVar8;
  PhrasalRule *pPVar9;
  NT *pNVar10;
  NT *pNVar11;
  short sVar12;
  Span SVar13;
  Rhs nts;
  char local_c1;
  Span local_c0;
  int local_bc;
  Span local_b8;
  int local_b4;
  NT *local_b0;
  AlignedSentencePair *local_a8;
  char *local_a0;
  size_t local_98;
  NT local_90 [4];
  
  local_a8 = rule->sentence;
  pPVar9 = rule;
  pNVar4 = local_90;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    pNVar4->span = (pPVar9->nts)._M_elems[0].span;
    pPVar9 = (PhrasalRule *)&(pPVar9->nts)._M_elems[0].label;
    pNVar4 = (NT *)&pNVar4->label;
  }
  pNVar4 = std::
           __find_if<jhu::thrax::NT*,__gnu_cxx::__ops::_Iter_pred<jhu::thrax::printRhs<false>(std::ostream&,jhu::thrax::PhrasalRule_const&)::_lambda(auto:1_const&)_1_>>
                     (local_90,&stack0xffffffffffffffd0);
  if (local_90 != pNVar4) {
    uVar7 = ((long)pNVar4 - (long)local_90 >> 3) * -0x5555555555555555;
    lVar6 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<jhu::thrax::NT*,long,__gnu_cxx::__ops::_Iter_comp_iter<jhu::thrax::printRhs<false>(std::ostream&,jhu::thrax::PhrasalRule_const&)::_lambda(auto:1,auto:2)_1_>>
              (local_90,pNVar4,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<jhu::thrax::NT*,__gnu_cxx::__ops::_Iter_comp_iter<jhu::thrax::printRhs<false>(std::ostream&,jhu::thrax::PhrasalRule_const&)::_lambda(auto:1,auto:2)_1_>>
              (local_90,pNVar4);
  }
  SVar13 = (rule->lhs).span.tgt;
  iVar8 = (int)SVar13 >> 0x10;
  iVar3 = (int)SVar13.start;
  if (iVar3 < iVar8) {
    local_b8 = local_90[0].span.tgt;
    local_c0 = (Span)((uint)local_90[0].span.tgt >> 0x10);
    local_bc = (int)SVar13.start;
    pNVar10 = local_90;
    local_b4 = iVar8;
    local_b0 = pNVar4;
    do {
      sVar12 = SVar13.start;
      if ((pNVar10 == pNVar4) || (sVar12 < local_b8.start)) {
        if (local_bc != iVar3) {
          local_c1 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(out,&local_c1,1);
        }
        pbVar1 = (local_a8->tgt).
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,pbVar1[sVar12]._M_str,pbVar1[sVar12]._M_len);
        pNVar11 = pNVar10;
        SVar13 = (Span)((int)SVar13 + 1);
      }
      else {
        if ((local_bc != iVar3) && (local_bc != local_b8.start)) {
          local_c1 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(out,&local_c1,1);
        }
        local_98 = (pNVar10->label)._M_len;
        local_a0 = (pNVar10->label)._M_str;
        iVar8 = 1;
        lVar6 = 0;
        do {
          bVar2 = SpanPair::operator==
                            ((SpanPair *)((long)&(rule->nts)._M_elems[0].span.src.start + lVar6),
                             pNVar10->span);
          if (bVar2) goto LAB_00105585;
          iVar8 = iVar8 + 1;
          lVar6 = lVar6 + 0x18;
        } while (lVar6 != 0x60);
        iVar8 = 0;
LAB_00105585:
        local_c1 = '[';
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_c1,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_a0,local_98);
        pNVar4 = local_b0;
        if (iVar8 != 0) {
          local_c1 = ',';
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_c1,1);
          std::ostream::operator<<(poVar5,iVar8);
        }
        local_c1 = ']';
        std::__ostream_insert<char,std::char_traits<char>>(out,&local_c1,1);
        pNVar11 = pNVar10 + 1;
        SVar13 = local_c0;
        iVar8 = local_b4;
        if (pNVar11 < pNVar4) {
          local_b8 = pNVar10[1].span.tgt;
          local_c0 = (Span)((uint)local_b8 >> 0x10);
        }
      }
      iVar3 = (int)SVar13.start;
      pNVar10 = pNVar11;
    } while (iVar3 < iVar8);
  }
  return;
}

Assistant:

inline void printRhs(std::ostream& out, const PhrasalRule& rule) {
  const auto& s = rule.sentence;
  constexpr auto empty = [](const auto& nt) { return nt.span.empty(); };
  auto nts = rule.nts;
  auto it = std::find_if(nts.begin(), nts.end(), empty);
  if constexpr (!SourceSide) {
    std::sort(
        nts.begin(),
        it,
        [](auto a, auto b) { return a.span.tgt.start < b.span.tgt.start; });
  }
  auto nt = nts.begin();
  auto [start, end] = rule.lhs.span.get<SourceSide>();
  auto [ntStart, ntEnd] = nt->span.get<SourceSide>();
  for (auto i = start; i < end; i++) {
    if (nt == it || i < ntStart) {
      if (i != start) {
        out << ' ';
      }
      if constexpr (SourceSide) {
        out << s.src[i];
      } else {
        out << s.tgt[i];
      }
    } else {
      if (i != start && ntStart != start) {
        out << ' ';
      }
      bracket(out, nt->label, rule.ntIndex(*nt));
      i = ntEnd - 1;
      nt++;
      if (nt < it) {
        auto [s, e] = nt->span.get<SourceSide>();
        ntStart = s;
        ntEnd = e;
      }
    }
  }
}